

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogStdoutColor.cpp
# Opt level: O3

void __thiscall liblogger::LogStdoutColor::Log(LogStdoutColor *this,LogType Type,string *str)

{
  pointer pcVar1;
  FILE *__stream;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  string *psVar5;
  int *piVar6;
  char *pcVar7;
  LogException *pLVar8;
  time_t current;
  stringstream ss;
  char buf [128];
  tm timeinfo;
  string sStack_288;
  time_t local_268;
  stringstream local_260 [16];
  ostream local_250 [376];
  char local_d8 [128];
  tm local_58;
  
  local_268 = time((time_t *)0x0);
  localtime_r(&local_268,&local_58);
  sVar4 = strftime(local_d8,0x80,"%F %T",&local_58);
  __stream = _stdout;
  if (sVar4 != 0) {
    switch(Type) {
    case LOGGER_DEBUG:
      psVar5 = LogTypeToStr_abi_cxx11_(LOGGER_DEBUG);
      pcVar1 = (psVar5->_M_dataplus)._M_p;
      uVar2 = getpid();
      iVar3 = fprintf(__stream,"\x1b[34m%s - %s [PID: %d] - %s\x1b[0m\n",local_d8,pcVar1,
                      (ulong)uVar2,(str->_M_dataplus)._M_p);
      if (iVar3 < 0) {
        std::__cxx11::stringstream::stringstream(local_260);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_250,"failed to write to stdout error:",0x20);
        piVar6 = __errno_location();
        pcVar7 = strerror(*piVar6);
        std::operator<<(local_250,pcVar7);
        pLVar8 = (LogException *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        LogException::LogException(pLVar8,&sStack_288);
        __cxa_throw(pLVar8,&LogException::typeinfo,LogException::~LogException);
      }
      break;
    case LOGGER_INFO:
      psVar5 = LogTypeToStr_abi_cxx11_(LOGGER_INFO);
      pcVar1 = (psVar5->_M_dataplus)._M_p;
      uVar2 = getpid();
      iVar3 = fprintf(__stream,"\x1b[32m%s - %s [PID: %d] - %s\x1b[0m\n",local_d8,pcVar1,
                      (ulong)uVar2,(str->_M_dataplus)._M_p);
      if (iVar3 < 0) {
        std::__cxx11::stringstream::stringstream(local_260);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_250,"failed to write to stdout error:",0x20);
        piVar6 = __errno_location();
        pcVar7 = strerror(*piVar6);
        std::operator<<(local_250,pcVar7);
        pLVar8 = (LogException *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        LogException::LogException(pLVar8,&sStack_288);
        __cxa_throw(pLVar8,&LogException::typeinfo,LogException::~LogException);
      }
      break;
    case LOGGER_NOTICE:
      psVar5 = LogTypeToStr_abi_cxx11_(LOGGER_NOTICE);
      pcVar1 = (psVar5->_M_dataplus)._M_p;
      uVar2 = getpid();
      iVar3 = fprintf(__stream,"\x1b[32m%s - %s [PID: %d] - %s\x1b[0m\n",local_d8,pcVar1,
                      (ulong)uVar2,(str->_M_dataplus)._M_p);
      if (iVar3 < 0) {
        std::__cxx11::stringstream::stringstream(local_260);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_250,"failed to write to stdout error:",0x20);
        piVar6 = __errno_location();
        pcVar7 = strerror(*piVar6);
        std::operator<<(local_250,pcVar7);
        pLVar8 = (LogException *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        LogException::LogException(pLVar8,&sStack_288);
        __cxa_throw(pLVar8,&LogException::typeinfo,LogException::~LogException);
      }
      break;
    case LOGGER_WARNING:
      psVar5 = LogTypeToStr_abi_cxx11_(LOGGER_WARNING);
      pcVar1 = (psVar5->_M_dataplus)._M_p;
      uVar2 = getpid();
      iVar3 = fprintf(__stream,"\x1b[33m%s - %s [PID: %d] - %s\x1b[0m\n",local_d8,pcVar1,
                      (ulong)uVar2,(str->_M_dataplus)._M_p);
      if (iVar3 < 0) {
        std::__cxx11::stringstream::stringstream(local_260);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_250,"failed to write to stdout error:",0x20);
        piVar6 = __errno_location();
        pcVar7 = strerror(*piVar6);
        std::operator<<(local_250,pcVar7);
        pLVar8 = (LogException *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        LogException::LogException(pLVar8,&sStack_288);
        __cxa_throw(pLVar8,&LogException::typeinfo,LogException::~LogException);
      }
      break;
    case LOGGER_ERR:
      psVar5 = LogTypeToStr_abi_cxx11_(LOGGER_ERR);
      pcVar1 = (psVar5->_M_dataplus)._M_p;
      uVar2 = getpid();
      iVar3 = fprintf(__stream,"\x1b[31m%s - %s [PID: %d] - %s\x1b[0m\n",local_d8,pcVar1,
                      (ulong)uVar2,(str->_M_dataplus)._M_p);
      if (iVar3 < 0) {
        std::__cxx11::stringstream::stringstream(local_260);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_250,"failed to write to stdout error:",0x20);
        piVar6 = __errno_location();
        pcVar7 = strerror(*piVar6);
        std::operator<<(local_250,pcVar7);
        pLVar8 = (LogException *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        LogException::LogException(pLVar8,&sStack_288);
        __cxa_throw(pLVar8,&LogException::typeinfo,LogException::~LogException);
      }
      break;
    case LOGGER_CRIT:
      psVar5 = LogTypeToStr_abi_cxx11_(LOGGER_CRIT);
      pcVar1 = (psVar5->_M_dataplus)._M_p;
      uVar2 = getpid();
      iVar3 = fprintf(__stream,"\x1b[35m%s - %s [PID: %d] - %s\x1b[0m\n",local_d8,pcVar1,
                      (ulong)uVar2,(str->_M_dataplus)._M_p);
      if (iVar3 < 0) {
        std::__cxx11::stringstream::stringstream(local_260);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_250,"failed to write to stdout error:",0x20);
        piVar6 = __errno_location();
        pcVar7 = strerror(*piVar6);
        std::operator<<(local_250,pcVar7);
        pLVar8 = (LogException *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        LogException::LogException(pLVar8,&sStack_288);
        __cxa_throw(pLVar8,&LogException::typeinfo,LogException::~LogException);
      }
      break;
    case LOGGER_ALERT:
      psVar5 = LogTypeToStr_abi_cxx11_(LOGGER_ALERT);
      pcVar1 = (psVar5->_M_dataplus)._M_p;
      uVar2 = getpid();
      iVar3 = fprintf(__stream,"\x1b[36m%s - %s [PID: %d] - %s\x1b[0m\n",local_d8,pcVar1,
                      (ulong)uVar2,(str->_M_dataplus)._M_p);
      if (iVar3 < 0) {
        std::__cxx11::stringstream::stringstream(local_260);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_250,"failed to write to stdout error:",0x20);
        piVar6 = __errno_location();
        pcVar7 = strerror(*piVar6);
        std::operator<<(local_250,pcVar7);
        pLVar8 = (LogException *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        LogException::LogException(pLVar8,&sStack_288);
        __cxa_throw(pLVar8,&LogException::typeinfo,LogException::~LogException);
      }
      break;
    case LOGGER_EMERG:
      psVar5 = LogTypeToStr_abi_cxx11_(LOGGER_EMERG);
      pcVar1 = (psVar5->_M_dataplus)._M_p;
      uVar2 = getpid();
      iVar3 = fprintf(__stream,"\x1b[36m%s - %s [PID: %d] - %s\x1b[0m\n",local_d8,pcVar1,
                      (ulong)uVar2,(str->_M_dataplus)._M_p);
      if (iVar3 < 0) {
        std::__cxx11::stringstream::stringstream(local_260);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_250,"failed to write to stdout error:",0x20);
        piVar6 = __errno_location();
        pcVar7 = strerror(*piVar6);
        std::operator<<(local_250,pcVar7);
        pLVar8 = (LogException *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        LogException::LogException(pLVar8,&sStack_288);
        __cxa_throw(pLVar8,&LogException::typeinfo,LogException::~LogException);
      }
      break;
    default:
      goto switchD_00133687_default;
    }
    iVar3 = fflush(_stdout);
    if (iVar3 < 0) {
      std::__cxx11::stringstream::stringstream(local_260);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_250,"failed to flush to stdout error:",0x20);
      piVar6 = __errno_location();
      pcVar7 = strerror(*piVar6);
      std::operator<<(local_250,pcVar7);
      pLVar8 = (LogException *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringbuf::str();
      LogException::LogException(pLVar8,&sStack_288);
      __cxa_throw(pLVar8,&LogException::typeinfo,LogException::~LogException);
    }
    return;
  }
switchD_00133687_default:
  abort();
}

Assistant:

void LogStdoutColor::Log(const LogType Type, const std::string &str) {
	time_t current = time(NULL);
	struct tm timeinfo;
	char buf[128];

	localtime_r(&current, &timeinfo);
	if (strftime(buf, sizeof(buf), "%F %T", &timeinfo) == 0)
		abort(); //Bug

	switch(Type)
	{
		case LOGGER_DEBUG:
			if (fprintf(stdout, COLOR_BLUE "%s - %s [PID: %d] - %s" COLOR_RESET "\n", buf, LogTypeToStr(Type).c_str(), getpid(), str.c_str()) < 0)
			{
				std::stringstream ss;
				ss << "failed to write to stdout error:" << strerror(errno);
				throw(LogException(ss.str()));
			}
			break;
		case LOGGER_INFO:
			if (fprintf(stdout, COLOR_GREEN "%s - %s [PID: %d] - %s" COLOR_RESET "\n", buf, LogTypeToStr(Type).c_str(), getpid(), str.c_str()) < 0)
			{
				std::stringstream ss;
				ss << "failed to write to stdout error:" << strerror(errno);
				throw(LogException(ss.str()));
			}
			break;
		case LOGGER_NOTICE:
			if (fprintf(stdout, COLOR_GREEN "%s - %s [PID: %d] - %s" COLOR_RESET "\n", buf, LogTypeToStr(Type).c_str(), getpid(), str.c_str()) < 0)
			{
				std::stringstream ss;
				ss << "failed to write to stdout error:" << strerror(errno);
				throw(LogException(ss.str()));
			}
			break;
		case LOGGER_WARNING:
			if (fprintf(stdout, COLOR_YELLOW "%s - %s [PID: %d] - %s" COLOR_RESET "\n", buf, LogTypeToStr(Type).c_str(), getpid(), str.c_str()) < 0)
			{
				std::stringstream ss;
				ss << "failed to write to stdout error:" << strerror(errno);
				throw(LogException(ss.str()));
			}
			break;
		case LOGGER_ERR:
			if (fprintf(stdout, COLOR_RED "%s - %s [PID: %d] - %s" COLOR_RESET "\n", buf, LogTypeToStr(Type).c_str(), getpid(), str.c_str()) < 0)
			{
				std::stringstream ss;
				ss << "failed to write to stdout error:" << strerror(errno);
				throw(LogException(ss.str()));
			}
			break;
		case LOGGER_CRIT:
			if (fprintf(stdout, COLOR_MAGENTA "%s - %s [PID: %d] - %s" COLOR_RESET "\n", buf, LogTypeToStr(Type).c_str(), getpid(), str.c_str()) < 0)
			{
				std::stringstream ss;
				ss << "failed to write to stdout error:" << strerror(errno);
				throw(LogException(ss.str()));
			}
			break;
		case LOGGER_ALERT:
			if (fprintf(stdout, COLOR_CYAN "%s - %s [PID: %d] - %s" COLOR_RESET "\n", buf, LogTypeToStr(Type).c_str(), getpid(), str.c_str()) < 0)
			{
				std::stringstream ss;
				ss << "failed to write to stdout error:" << strerror(errno);
				throw(LogException(ss.str()));
			}
			break;
		case LOGGER_EMERG:
			if (fprintf(stdout, COLOR_CYAN "%s - %s [PID: %d] - %s" COLOR_RESET "\n", buf, LogTypeToStr(Type).c_str(), getpid(), str.c_str()) < 0)
			{
				std::stringstream ss;
				ss << "failed to write to stdout error:" << strerror(errno);
				throw(LogException(ss.str()));
			}
			break;
		default:
			abort(); //Should be unreachable
			break;

	}

	if (fflush(stdout) < 0)
	{
		std::stringstream ss;
		ss << "failed to flush to stdout error:" << strerror(errno);
		throw(LogException(ss.str()));
	}
}